

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_relation.cpp
# Opt level: O2

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::LimitRelation::GetQueryNode(LimitRelation *this)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  Relation *pRVar3;
  pointer pLVar4;
  pointer pQVar5;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_68;
  _Head_base<0UL,_duckdb::LimitModifier_*,_false> local_60;
  Value local_58;
  
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x78));
  (*pRVar3->_vptr_Relation[3])(this,pRVar3);
  make_uniq<duckdb::LimitModifier>();
  if (-1 < *(long *)(in_RSI + 0x68)) {
    Value::BIGINT(&local_58,*(long *)(in_RSI + 0x68));
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_68,&local_58);
    _Var2._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (ParsedExpression *)0x0;
    pLVar4 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>::
             operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                         *)&local_60);
    _Var1._M_head_impl =
         (pLVar4->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_68._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    local_68._M_head_impl = (ParsedExpression *)0x0;
    Value::~Value(&local_58);
  }
  if (0 < *(long *)(in_RSI + 0x70)) {
    Value::BIGINT(&local_58,*(long *)(in_RSI + 0x70));
    make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_68,&local_58);
    _Var2._M_head_impl = local_68._M_head_impl;
    local_68._M_head_impl = (ParsedExpression *)0x0;
    pLVar4 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>::
             operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                         *)&local_60);
    _Var1._M_head_impl =
         (pLVar4->offset).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->offset).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    if (local_68._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_68._M_head_impl + 8))();
    }
    local_68._M_head_impl = (ParsedExpression *)0x0;
    Value::~Value(&local_58);
  }
  pQVar5 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )this);
  local_58.type_._0_8_ = local_60._M_head_impl;
  local_60._M_head_impl = (LimitModifier *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
              *)&pQVar5->modifiers,
             (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)&local_58);
  if ((LimitModifier *)local_58.type_._0_8_ != (LimitModifier *)0x0) {
    (*((ResultModifier *)local_58.type_._0_8_)->_vptr_ResultModifier[1])();
  }
  if (local_60._M_head_impl != (LimitModifier *)0x0) {
    (*((local_60._M_head_impl)->super_ResultModifier)._vptr_ResultModifier[1])();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> LimitRelation::GetQueryNode() {
	auto child_node = child->GetQueryNode();
	auto limit_node = make_uniq<LimitModifier>();
	if (limit >= 0) {
		limit_node->limit = make_uniq<ConstantExpression>(Value::BIGINT(limit));
	}
	if (offset > 0) {
		limit_node->offset = make_uniq<ConstantExpression>(Value::BIGINT(offset));
	}

	child_node->modifiers.push_back(std::move(limit_node));
	return child_node;
}